

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThree.cpp
# Opt level: O2

void __thiscall BlueRoomThree::BlueRoomThree(BlueRoomThree *this,string *rn,ItemTable *iList,bool f)

{
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Room::Room(&this->super_Room);
  (this->super_Room)._vptr_Room = (_func_int **)&PTR_getDescription_abi_cxx11__00133850;
  (this->super_Room).table = iList;
  std::__cxx11::string::assign((char *)&(this->super_Room).displayName);
  std::__cxx11::string::string
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/RoomDescriptions/"
             ,&local_61);
  std::operator+(&local_40,&local_60,rn);
  std::__cxx11::string::operator=((string *)&(this->super_Room).roomName,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_Room).showLongDescription = f;
  Room::parseData(&this->super_Room);
  return;
}

Assistant:

BlueRoomThree::BlueRoomThree(std::string rn, ItemTable *iList, bool f) {
    table = iList;
    displayName = "Iced Piping";
    roomName = std::string(RESOURCES_PATH) + rn;
    showLongDescription = f;
    parseData();
}